

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

long __thiscall tetgenmesh::improvequalitybysmoothing(tetgenmesh *this,optparameters *opm)

{
  tetrahedron *pppdVar1;
  bool bVar2;
  int iVar3;
  verttype vVar4;
  arraypool *paVar5;
  uint local_6c;
  uint local_68;
  int k;
  int j;
  int i;
  int iter;
  int smtflag;
  long smtcount;
  long totalsmtcount;
  point *ppt;
  badface *parybface;
  badface *bface;
  triface *parytet;
  arraypool *swapqueue;
  arraypool *flipqueue;
  optparameters *opm_local;
  tetgenmesh *this_local;
  
  flipqueue = (arraypool *)opm;
  opm_local = (optparameters *)this;
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,0x88,10);
  swapqueue = this->unflipqueue;
  this->unflipqueue = paVar5;
  smtcount = 0;
  j = 0;
  parytet = (triface *)paVar5;
  while (0 < swapqueue->objects) {
    _iter = 0;
    if (1 < this->b->verbose) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",(ulong)(uint)j,
             swapqueue->objects);
    }
    for (local_6c = 0; (long)(int)local_6c < swapqueue->objects; local_6c = local_6c + 1) {
      parybface = (badface *)
                  (swapqueue->toparray
                   [(int)local_6c >> ((byte)swapqueue->log2objectsperblock & 0x1f)] +
                  (int)((local_6c & swapqueue->objectsperblockmark) * swapqueue->objectbytes));
      iVar3 = gettetrahedron(this,parybface->forg,parybface->fdest,parybface->fapex,parybface->foppo
                             ,(triface *)parybface);
      if ((iVar3 != 0) && (bVar2 = marktested(this,&parybface->tt), !bVar2)) {
        pppdVar1 = (parybface->tt).tet;
        totalsmtcount = (long)(pppdVar1 + 4);
        tetalldihedral(this,(point)*(tetrahedron *)totalsmtcount,(point)pppdVar1[5],
                       (point)pppdVar1[6],(point)pppdVar1[7],parybface->cent,&parybface->key,
                       (double *)0x0);
        if (parybface->key < this->cossmtdihed) {
          i = 0;
          *(double *)&flipqueue->toparraylen = parybface->key + 1.0;
          for (k = 0; k < 4 && i == 0; k = k + 1) {
            vVar4 = pointtype(this,*(point *)(totalsmtcount + (long)k * 8));
            if (vVar4 == FREEVOLVERTEX) {
              getvertexstar(this,1,*(point *)(totalsmtcount + (long)k * 8),this->cavetetlist,
                            (arraypool *)0x0,(arraypool *)0x0);
              flipqueue->totalmemory = 0x3f50624dd2f1a9fc;
              i = smoothpoint(this,*(point *)(totalsmtcount + (long)k * 8),this->cavetetlist,1,
                              (optparameters *)flipqueue);
              if (i != 0) {
                while (flipqueue[1].objectsperblock == flipqueue[1].objectbytes) {
                  flipqueue->totalmemory = (unsigned_long)((double)flipqueue->totalmemory * 10.0);
                  *(char ***)&flipqueue->toparraylen = flipqueue->toparray;
                  flipqueue[1].objectsperblock = 0;
                  smoothpoint(this,*(point *)(totalsmtcount + (long)k * 8),this->cavetetlist,1,
                              (optparameters *)flipqueue);
                }
                _iter = _iter + 1;
                if ((double)flipqueue->toparray - 1.0 < this->cossmtdihed) {
                  for (local_68 = 0; (long)(int)local_68 < this->cavetetlist->objects;
                      local_68 = local_68 + 1) {
                    bface = (badface *)
                            (this->cavetetlist->toparray
                             [(int)local_68 >> ((byte)this->cavetetlist->log2objectsperblock & 0x1f)
                             ] + (int)((local_68 & this->cavetetlist->objectsperblockmark) *
                                      this->cavetetlist->objectbytes));
                    bVar2 = marktested(this,(triface *)bface);
                    if (!bVar2) {
                      pppdVar1 = (bface->tt).tet;
                      totalsmtcount = (long)(pppdVar1 + 4);
                      tetalldihedral(this,(point)*(tetrahedron *)totalsmtcount,(point)pppdVar1[5],
                                     (point)pppdVar1[6],(point)pppdVar1[7],parybface->cent,
                                     &parybface->key,(double *)0x0);
                      if (parybface->key < this->cossmtdihed) {
                        marktest(this,&bface->tt);
                        arraypool::newindex(this->unflipqueue,&ppt);
                        triface::operator=((triface *)ppt,&bface->tt);
                        ppt[0xb] = (point)*(tetrahedron *)totalsmtcount;
                        ppt[0xc] = (point)pppdVar1[5];
                        ppt[0xd] = (point)pppdVar1[6];
                        ppt[0xe] = (point)pppdVar1[7];
                        *(undefined4 *)(ppt + 1) = 0xb;
                        ppt[4] = (point)0x0;
                      }
                    }
                  }
                }
              }
              arraypool::restart(this->cavetetlist);
            }
          }
          if (i == 0) {
            marktest(this,&parybface->tt);
            arraypool::newindex(this->unflipqueue,&ppt);
            triface::operator=((triface *)ppt,&parybface->tt);
            ppt[0xb] = *(point *)totalsmtcount;
            ppt[0xc] = *(point *)(totalsmtcount + 8);
            ppt[0xd] = *(point *)(totalsmtcount + 0x10);
            ppt[0xe] = *(point *)(totalsmtcount + 0x18);
            *(undefined4 *)(ppt + 1) = 0xb;
            ppt[4] = (point)0x0;
          }
        }
      }
    }
    arraypool::restart(swapqueue);
    for (k = 0; (long)k < this->unflipqueue->objects; k = k + 1) {
      parybface = (badface *)
                  (this->unflipqueue->toparray
                   [k >> ((byte)this->unflipqueue->log2objectsperblock & 0x1f)] +
                  (k & this->unflipqueue->objectsperblockmark) * this->unflipqueue->objectbytes);
      unmarktest(this,(triface *)parybface);
    }
    if (1 < this->b->verbose) {
      printf("    Smooth %ld points.\n",_iter);
    }
    smtcount = _iter + smtcount;
    if ((_iter == 0) || (j = j + 1, j == 2)) break;
    parytet = (triface *)swapqueue;
    paVar5 = this->unflipqueue;
    this->unflipqueue = swapqueue;
    swapqueue = paVar5;
  }
  paVar5 = swapqueue;
  if (swapqueue != (arraypool *)0x0) {
    arraypool::~arraypool(swapqueue);
    operator_delete(paVar5,0x30);
  }
  return smtcount;
}

Assistant:

long tetgenmesh::improvequalitybysmoothing(optparameters *opm)
{
  arraypool *flipqueue, *swapqueue;
  triface *parytet;
  badface *bface, *parybface;
  point *ppt;
  long totalsmtcount, smtcount;
  int smtflag;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsmtcount = 0l;
  iter = 0;

  while (flipqueue->objects > 0l) {

    smtcount = 0l;

    if (b->verbose > 1) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; k < flipqueue->objects; k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        // Operate on it if it is not in 'unflipqueue'.
        if (!marktested(bface->tt)) {
          // Here we simply re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
          if (bface->key < cossmtdihed) { // if (maxdd < cosslidihed) {
            // It is a sliver. Try to smooth its vertices.
            smtflag = 0;
            opm->initval = bface->key + 1.0; 
            for (i = 0; (i < 4) && !smtflag; i++) {
              if (pointtype(ppt[i]) == FREEVOLVERTEX) {
                getvertexstar(1, ppt[i], cavetetlist, NULL, NULL);
                opm->searchstep = 0.001; // Search step size
                smtflag = smoothpoint(ppt[i], cavetetlist, 1, opm);
                if (smtflag) {
                  while (opm->smthiter == opm->maxiter) {
                    opm->searchstep *= 10.0; // Increase the step size.
                    opm->initval = opm->imprval;
                    opm->smthiter = 0; // reset
                    smoothpoint(ppt[i], cavetetlist, 1, opm);
                  }
                  // This tet is modifed.
                  smtcount++;
                  if ((opm->imprval - 1.0) < cossmtdihed) {
                    // There are slivers in new tets. Queue them.
                    for (j = 0; j < cavetetlist->objects; j++) {
                      parytet = (triface *) fastlookup(cavetetlist, j);
                      // Operate it if it is not in 'unflipqueue'.
                      if (!marktested(*parytet)) {
                        // Evaluate its quality.
                        // Re-use ppt, bface->key, bface->cent.
                        ppt = (point *) & (parytet->tet[4]);
                        tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], 
                                       bface->cent, &bface->key, NULL);
                        if (bface->key < cossmtdihed) {
                          // A new sliver. Queue it.
                          marktest(*parytet); // It is in unflipqueue.
                          unflipqueue->newindex((void **) &parybface);
                          parybface->tt = *parytet;
                          parybface->forg = ppt[0];
                          parybface->fdest = ppt[1];
                          parybface->fapex = ppt[2];
                          parybface->foppo = ppt[3];
                          parybface->tt.ver = 11; 
                          parybface->key = 0.0;
                        }
                      }
                    } // j
                  } // if ((opm->imprval - 1.0) < cossmtdihed)
                } // if (smtflag)
                cavetetlist->restart();
              } // if (pointtype(ppt[i]) == FREEVOLVERTEX)
            } // i
            if (!smtflag) {
              // Didn't smooth. Queue it again.
              marktest(bface->tt); // It is in unflipqueue.
              unflipqueue->newindex((void **) &parybface);
              parybface->tt = bface->tt;
              parybface->forg = ppt[0];
              parybface->fdest = ppt[1];
              parybface->fapex = ppt[2];
              parybface->foppo = ppt[3];
              parybface->tt.ver = 11;
              parybface->key = 0.0;
            }
	      } // if (maxdd < cosslidihed)
        } // if (!marktested(...))
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    // Unmark the tets in unflipqueue.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface  = (badface *) fastlookup(unflipqueue, i);
      unmarktest(bface->tt);
    }

    if (b->verbose > 1) {
      printf("    Smooth %ld points.\n", smtcount);
    }
    totalsmtcount += smtcount;

    if (smtcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsmtcount;
}